

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O1

void __thiscall ASN1Test_StringByCustomNID_Test::TestBody(ASN1Test_StringByCustomNID_Test *this)

{
  undefined1 auVar1 [8];
  _Head_base<0UL,_asn1_string_st_*,_false> _Var2;
  int iVar3;
  long *plVar4;
  ASN1_STRING *pAVar5;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar6;
  char *pcVar7;
  char *in_R9;
  pointer *__ptr_1;
  bool bVar8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  UniquePtr<ASN1_STRING> str;
  int nid1;
  int nid2;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  Bytes local_58;
  AssertHelper local_48;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  _Head_base<0UL,_asn1_string_st_*,_false> local_20;
  int local_18;
  int local_14;
  
  local_18 = OBJ_create("1.2.840.113554.4.1.72585.1000","custom OID 1000","custom OID 1000");
  local_68 = (undefined1  [8])((ulong)(uint)local_68._4_4_ << 0x20);
  testing::internal::CmpHelperNE<int,int>((internal *)local_40,"0","nid1",(int *)local_68,&local_18)
  ;
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x749,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_68);
  }
  else {
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
    local_14 = OBJ_create("1.2.840.113554.4.1.72585.1001","custom OID 1001","custom OID 1001");
    local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffff00000000);
    testing::internal::CmpHelperNE<int,int>
              ((internal *)local_40,"0","nid2",(int *)local_68,&local_14);
    if (local_40[0] != (internal)0x0) {
      if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_38,local_38);
      }
      iVar3 = ASN1_STRING_TABLE_add(local_18,5,10,0x13,2);
      local_68[0] = iVar3 != 0;
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 != 0) {
        local_20._M_head_impl =
             (asn1_string_st *)
             ASN1_STRING_set_by_NID((ASN1_STRING **)0x0,(uchar *)"12345",5,0x1000,local_18);
        auVar1 = local_68;
        local_68[0] = local_20._M_head_impl != (asn1_string_st *)0x0;
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_20._M_head_impl == (asn1_string_st *)0x0) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_40,(internal *)local_68,(AssertionResult *)0x53b4ea,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x754,(char *)CONCAT71(local_40._1_7_,local_40[0]));
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
        }
        else {
          local_68._4_4_ = auVar1._4_4_;
          local_68._0_4_ = 0x13;
          iVar3 = ASN1_STRING_type((ASN1_STRING *)local_20._M_head_impl);
          local_58.span_.data_ = (uchar *)CONCAT44(local_58.span_.data_._4_4_,iVar3);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_40,"19","ASN1_STRING_type(str.get())",(int *)local_68,
                     (int *)&local_58);
          if (local_40[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_68);
            if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar7 = "";
            }
            else {
              pcVar7 = (local_38->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x755,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_58,(Message *)local_68);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
            if (local_68 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_68 + 8))();
            }
          }
          if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_38,local_38);
          }
          local_68 = (undefined1  [8])0x535d78;
          local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
          plVar4 = (long *)ASN1_STRING_get0_data(local_20._M_head_impl);
          iVar3 = ASN1_STRING_length((ASN1_STRING *)local_20._M_head_impl);
          local_58.span_.size_ = (size_t)iVar3;
          local_58.span_.data_ = (uchar *)plVar4;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_40,"Bytes(\"12345\")",
                     "Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get()))",
                     (Bytes *)local_68,&local_58);
          if (local_40[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_68);
            if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar7 = "";
            }
            else {
              pcVar7 = (local_38->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x757,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_58,(Message *)local_68);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
            if (local_68 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_68 + 8))();
            }
          }
          if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_38,local_38);
          }
          pAVar5 = ASN1_STRING_set_by_NID((ASN1_STRING **)0x0,"1234",4,0x1000,local_18);
          _Var2._M_head_impl = local_20._M_head_impl;
          bVar8 = local_20._M_head_impl != (asn1_string_st *)0x0;
          local_20._M_head_impl = (asn1_string_st *)pAVar5;
          if (bVar8) {
            ASN1_STRING_free((ASN1_STRING *)_Var2._M_head_impl);
          }
          local_68[0] = local_20._M_head_impl == (asn1_string_st *)0x0;
          local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_20._M_head_impl != (asn1_string_st *)0x0) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_40,(internal *)local_68,(AssertionResult *)0x53b4ea,"true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x75d,(char *)CONCAT71(local_40._1_7_,local_40[0]));
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_40._1_7_,local_40[0]),
                              local_30._M_allocated_capacity + 1);
            }
            if ((long *)local_58.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_58.span_.data_ + 8))();
            }
          }
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_60,local_60);
          }
          ERR_clear_error();
          pAVar5 = ASN1_STRING_set_by_NID
                             ((ASN1_STRING **)0x0,(uchar *)"12345678901",0xb,0x1000,local_18);
          _Var2._M_head_impl = local_20._M_head_impl;
          bVar8 = local_20._M_head_impl != (asn1_string_st *)0x0;
          local_20._M_head_impl = (asn1_string_st *)pAVar5;
          if (bVar8) {
            ASN1_STRING_free((ASN1_STRING *)_Var2._M_head_impl);
          }
          local_68[0] = local_20._M_head_impl == (asn1_string_st *)0x0;
          local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_20._M_head_impl != (asn1_string_st *)0x0) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_40,(internal *)local_68,(AssertionResult *)0x53b4ea,"true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x762,(char *)CONCAT71(local_40._1_7_,local_40[0]));
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_40._1_7_,local_40[0]),
                              local_30._M_allocated_capacity + 1);
            }
            if ((long *)local_58.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_58.span_.data_ + 8))();
            }
          }
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_60,local_60);
          }
          ERR_clear_error();
          iVar3 = ASN1_STRING_TABLE_add(local_14,-1,-1,0x2806,0);
          local_68[0] = iVar3 != 0;
          local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar3 == 0) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_40,(internal *)local_68,
                       (AssertionResult *)
                       "ASN1_STRING_TABLE_add(nid2, -1, -1, (0x0002 | 0x0004 | 0x0800 | 0x2000), 0)"
                       ,"false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x767,(char *)CONCAT71(local_40._1_7_,local_40[0]));
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
          }
          else {
            pAVar5 = ASN1_STRING_set_by_NID((ASN1_STRING **)0x0,(uchar *)"12345",5,0x1000,local_14);
            _Var2._M_head_impl = local_20._M_head_impl;
            bVar8 = local_20._M_head_impl != (asn1_string_st *)0x0;
            local_20._M_head_impl = (asn1_string_st *)pAVar5;
            if (bVar8) {
              ASN1_STRING_free((ASN1_STRING *)_Var2._M_head_impl);
            }
            auVar1 = local_68;
            local_68[0] = local_20._M_head_impl != (asn1_string_st *)0x0;
            local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_20._M_head_impl == (asn1_string_st *)0x0) {
              testing::Message::Message((Message *)&local_58);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_40,(internal *)local_68,(AssertionResult *)0x53b4ea,"false"
                         ,"true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x76b,(char *)CONCAT71(local_40._1_7_,local_40[0]));
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
            }
            else {
              local_68._4_4_ = auVar1._4_4_;
              local_68._0_4_ = 0xc;
              iVar3 = ASN1_STRING_type((ASN1_STRING *)local_20._M_head_impl);
              local_58.span_.data_ = (uchar *)CONCAT44(local_58.span_.data_._4_4_,iVar3);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_40,"12","ASN1_STRING_type(str.get())",(int *)local_68,
                         (int *)&local_58);
              if (local_40[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_68);
                if (local_38 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_38->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_58,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x76c,pcVar7);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_58,(Message *)local_68);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
                if (local_68 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_68 + 8))();
                }
              }
              if (local_38 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_38,local_38);
              }
              local_68 = (undefined1  [8])0x535d78;
              local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
              plVar4 = (long *)ASN1_STRING_get0_data(local_20._M_head_impl);
              iVar3 = ASN1_STRING_length((ASN1_STRING *)local_20._M_head_impl);
              local_58.span_.size_ = (size_t)iVar3;
              local_58.span_.data_ = (uchar *)plVar4;
              testing::internal::CmpHelperEQ<Bytes,Bytes>
                        ((internal *)local_40,"Bytes(\"12345\")",
                         "Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get()))",
                         (Bytes *)local_68,&local_58);
              if (local_40[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_68);
                if (local_38 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_38->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_58,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x76e,pcVar7);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_58,(Message *)local_68);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
                if (local_68 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_68 + 8))();
                }
              }
              if (local_38 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_38,local_38);
              }
              iVar3 = ASN1_STRING_TABLE_add(0xe,-1,-1,0x2806,0);
              local_68[0] = iVar3 == 0;
              local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar3 != 0) {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_40,(internal *)local_68,
                           (AssertionResult *)
                           "ASN1_STRING_TABLE_add(14, -1, -1, (0x0002 | 0x0004 | 0x0800 | 0x2000), 0)"
                           ,"true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_48,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x772,(char *)CONCAT71(local_40._1_7_,local_40[0]));
                testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_48);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_40._1_7_,local_40[0]),
                                  local_30._M_allocated_capacity + 1);
                }
                if ((long *)local_58.span_.data_ != (long *)0x0) {
                  (**(code **)(*(long *)local_58.span_.data_ + 8))();
                }
              }
              if (local_60 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_60,local_60);
              }
              iVar3 = ASN1_STRING_TABLE_add(local_18,-1,-1,0x2806,0);
              local_68[0] = iVar3 == 0;
              local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar3 == 0) goto LAB_001dac3a;
              testing::Message::Message((Message *)&local_58);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_40,(internal *)local_68,
                         (AssertionResult *)
                         "ASN1_STRING_TABLE_add(nid1, -1, -1, (0x0002 | 0x0004 | 0x0800 | 0x2000), 0)"
                         ,"true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x773,(char *)CONCAT71(local_40._1_7_,local_40[0]));
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
            }
          }
        }
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1
                         );
        }
        if ((long *)local_58.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_58.span_.data_ + 8))();
        }
LAB_001dac3a:
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_20);
        return;
      }
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_60;
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_40,(internal *)local_68,
                 (AssertionResult *)"ASN1_STRING_TABLE_add(nid1, 5, 10, 19, 0x02)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x750,(char *)CONCAT71(local_40._1_7_,local_40[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
      }
      if ((long *)local_58.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_58.span_.data_ + 8))();
      }
      local_38 = local_60;
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      goto LAB_001da450;
    }
    testing::Message::Message((Message *)local_68);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x74c,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_68);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
  if (local_68 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_68 + 8))();
  }
  if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_38;
LAB_001da450:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_38);
  return;
}

Assistant:

TEST(ASN1Test, StringByCustomNID) {
  // This test affects library-global state. We rely on nothing else in the test
  // suite using these OIDs.
  int nid1 = OBJ_create("1.2.840.113554.4.1.72585.1000", "custom OID 1000",
                        "custom OID 1000");
  ASSERT_NE(NID_undef, nid1);
  int nid2 = OBJ_create("1.2.840.113554.4.1.72585.1001", "custom OID 1001",
                        "custom OID 1001");
  ASSERT_NE(NID_undef, nid2);

  // Values registered in the string table should be picked up.
  ASSERT_TRUE(ASN1_STRING_TABLE_add(nid1, 5, 10, V_ASN1_PRINTABLESTRING,
                                    STABLE_NO_MASK));
  bssl::UniquePtr<ASN1_STRING> str(ASN1_STRING_set_by_NID(
      nullptr, reinterpret_cast<const uint8_t *>("12345"), 5, MBSTRING_UTF8,
      nid1));
  ASSERT_TRUE(str);
  EXPECT_EQ(V_ASN1_PRINTABLESTRING, ASN1_STRING_type(str.get()));
  EXPECT_EQ(Bytes("12345"), Bytes(ASN1_STRING_get0_data(str.get()),
                                  ASN1_STRING_length(str.get())));

  // Minimum and maximum lengths are enforced.
  str.reset(ASN1_STRING_set_by_NID(nullptr,
                                   reinterpret_cast<const uint8_t *>("1234"), 4,
                                   MBSTRING_UTF8, nid1));
  EXPECT_FALSE(str);
  ERR_clear_error();
  str.reset(ASN1_STRING_set_by_NID(
      nullptr, reinterpret_cast<const uint8_t *>("12345678901"), 11,
      MBSTRING_UTF8, nid1));
  EXPECT_FALSE(str);
  ERR_clear_error();

  // Without |STABLE_NO_MASK|, we always pick UTF8String. -1 means there is no
  // length limit.
  ASSERT_TRUE(ASN1_STRING_TABLE_add(nid2, -1, -1, DIRSTRING_TYPE, 0));
  str.reset(ASN1_STRING_set_by_NID(nullptr,
                                   reinterpret_cast<const uint8_t *>("12345"),
                                   5, MBSTRING_UTF8, nid2));
  ASSERT_TRUE(str);
  EXPECT_EQ(V_ASN1_UTF8STRING, ASN1_STRING_type(str.get()));
  EXPECT_EQ(Bytes("12345"), Bytes(ASN1_STRING_get0_data(str.get()),
                                  ASN1_STRING_length(str.get())));

  // Overriding existing entries, built-in or custom, is an error.
  EXPECT_FALSE(
      ASN1_STRING_TABLE_add(NID_countryName, -1, -1, DIRSTRING_TYPE, 0));
  EXPECT_FALSE(ASN1_STRING_TABLE_add(nid1, -1, -1, DIRSTRING_TYPE, 0));
}